

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

void Emb_ManPrintFanio(Emb_Man_t *p)

{
  int *piVar1;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  void *__s;
  int iVar5;
  size_t __n;
  int iVar6;
  uint uVar7;
  uint uVar8;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  char Buffer [100];
  void *local_d8;
  uint local_cc;
  double local_c8;
  ulong local_c0;
  char local_98 [104];
  ulong uVar9;
  
  iVar14 = p->nObjData;
  dVar15 = 0.0;
  uVar4 = 10;
  if (iVar14 < 1) {
LAB_0068c67d:
    local_cc = 0;
    local_c0 = 0;
    local_c8 = 0.0;
    uVar13 = 0;
  }
  else {
    piVar2 = p->pObjData;
    uVar11 = 0;
    iVar5 = 0;
    iVar6 = 0;
    local_c0 = 0;
    local_cc = 0;
    do {
      if (piVar2 == (int *)0x0) goto LAB_0068c67d;
      uVar13 = (ulong)uVar11;
      uVar7 = piVar2[uVar13];
      if ((uVar13 == 0) || ((uVar7 & 3) != 0)) {
        uVar8 = piVar2[uVar13 + 1];
      }
      else {
        uVar12 = uVar7 >> 4;
        uVar8 = piVar2[uVar13 + 1];
        iVar6 = iVar6 + uVar12;
        iVar5 = iVar5 + uVar8;
        if (local_cc <= uVar12) {
          local_cc = uVar12;
        }
        if ((int)local_c0 <= (int)uVar8) {
          local_c0 = (ulong)uVar8;
        }
      }
      uVar11 = uVar11 + (uVar7 >> 4) + uVar8 + 5;
    } while ((int)uVar11 < iVar14);
    uVar4 = local_cc;
    if (1 < local_cc) {
      uVar13 = (ulong)(local_cc - 1);
      uVar4 = 0;
      do {
        uVar11 = (uint)uVar13;
        uVar13 = uVar13 / 10;
        uVar4 = uVar4 + 1;
      } while (9 < uVar11);
    }
    dVar15 = (double)iVar6;
    local_c8 = (double)iVar5;
    uVar4 = uVar4 * 10 + 10;
    uVar13 = local_c0;
    if (1 < (uint)local_c0) {
      uVar13 = 0;
      uVar11 = (uint)local_c0 - 1;
      do {
        uVar13 = (ulong)((int)uVar13 + 1);
        bVar3 = 9 < uVar11;
        uVar11 = uVar11 / 10;
      } while (bVar3);
    }
  }
  uVar11 = (int)uVar13 * 10 + 10;
  if ((int)uVar11 < (int)uVar4) {
    uVar11 = uVar4;
  }
  uVar4 = 0x10;
  if (0xe < uVar11 - 1) {
    uVar4 = uVar11;
  }
  if (uVar4 == 0) {
    __n = (long)(int)uVar11 << 2;
    __s = (void *)0x0;
    memset((void *)0x0,0,__n);
    local_d8 = (void *)0x0;
  }
  else {
    __s = malloc((long)(int)uVar4 << 2);
    __n = (long)(int)uVar11 << 2;
    memset(__s,0,__n);
    local_d8 = malloc((long)(int)uVar4 << 2);
  }
  memset(local_d8,0,__n);
  if ((0 < iVar14) && (piVar2 = p->pObjData, piVar2 != (int *)0x0)) {
    uVar13 = 0;
    do {
      uVar4 = piVar2[uVar13];
      if (((int)uVar13 == 0) || ((uVar4 & 3) != 0)) {
        uVar7 = piVar2[uVar13 + 1];
      }
      else {
        uVar8 = uVar4 >> 4;
        uVar9 = (ulong)uVar8;
        uVar7 = piVar2[uVar13 + 1];
        if (uVar4 < 0xa0) {
joined_r0x0068c7b1:
          if ((int)uVar11 <= (int)uVar8) goto LAB_0068cb92;
LAB_0068c866:
          piVar1 = (int *)((long)__s + uVar9 * 4);
          *piVar1 = *piVar1 + 1;
        }
        else {
          if (uVar4 < 0x640) {
            bVar10 = (char)((uVar8 & 0xff) / 10) + 10;
            uVar9 = (ulong)bVar10;
            uVar8 = (uint)bVar10;
            goto joined_r0x0068c7b1;
          }
          if (uVar4 < 16000) {
            uVar8 = (uVar8 & 0xffff) / 100 + 0x14;
LAB_0068c7fe:
            if ((int)uVar11 <= (int)uVar8) goto LAB_0068cb92;
            uVar9 = (ulong)uVar8;
            goto LAB_0068c866;
          }
          if (uVar4 < 160000) {
            uVar8 = (uVar8 & 0xffff) / 1000 + 0x1e;
            goto LAB_0068c7fe;
          }
          if (uVar4 < 1600000) {
            uVar8 = uVar4 / 160000 + 0x28;
LAB_0068c85a:
            if ((int)uVar11 <= (int)uVar8) goto LAB_0068cb92;
            uVar9 = (ulong)uVar8;
            goto LAB_0068c866;
          }
          if (uVar4 < 16000000) {
            uVar8 = uVar4 / 1600000 + 0x32;
            goto LAB_0068c85a;
          }
          if (uVar4 < 160000000) {
            uVar8 = uVar4 / 16000000 + 0x3c;
            goto LAB_0068c85a;
          }
        }
        if ((int)uVar7 < 10) {
          if (((int)uVar7 < 0) || ((int)uVar11 <= (int)uVar7)) goto LAB_0068cb92;
          piVar1 = (int *)((long)local_d8 + (ulong)uVar7 * 4);
          *piVar1 = *piVar1 + 1;
        }
        else {
          if (uVar7 < 100) {
            bVar10 = (char)((uVar7 & 0xff) / 10) + 10;
            uVar9 = (ulong)bVar10;
            if ((int)uVar11 <= (int)(uint)bVar10) goto LAB_0068cb92;
          }
          else {
            if (uVar7 < 1000) {
              uVar8 = (uVar7 & 0xffff) / 100 + 0x14;
            }
            else {
              if (9999 < uVar7) {
                if (uVar7 < 100000) {
                  uVar8 = uVar7 / 10000 + 0x28;
                }
                else if (uVar7 < 1000000) {
                  uVar8 = uVar7 / 100000 + 0x32;
                }
                else {
                  if (9999999 < uVar7) goto LAB_0068c96d;
                  uVar8 = uVar7 / 1000000 + 0x3c;
                }
                if ((int)uVar11 <= (int)uVar8) goto LAB_0068cb92;
                uVar9 = (ulong)uVar8;
                goto LAB_0068c965;
              }
              uVar8 = (uVar7 & 0xffff) / 1000 + 0x1e;
            }
            if ((int)uVar11 <= (int)uVar8) {
LAB_0068cb92:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            uVar9 = (ulong)uVar8;
          }
LAB_0068c965:
          piVar1 = (int *)((long)local_d8 + uVar9 * 4);
          *piVar1 = *piVar1 + 1;
        }
      }
LAB_0068c96d:
      uVar4 = uVar7 + (int)uVar13 + (uVar4 >> 4) + 5;
      uVar13 = (ulong)uVar4;
    } while ((int)uVar4 < iVar14);
  }
  puts("The distribution of fanins and fanouts in the network:");
  puts("         Number   Nodes with fanin  Nodes with fanout");
  if ((int)uVar11 < 1) {
    if (__s == (void *)0x0) goto LAB_0068cb00;
  }
  else {
    uVar13 = 0;
    do {
      if ((*(int *)((long)__s + uVar13 * 4) != 0) || (*(int *)((long)local_d8 + uVar13 * 4) != 0)) {
        if (uVar13 < 10) {
          printf("%15d : ",uVar13 & 0xffffffff);
        }
        else {
          iVar14 = (int)((uVar13 & 0xffffffff) / 10) * -10;
          dVar16 = (double)(int)((uVar13 & 0xffffffff) / 10);
          dVar17 = pow(10.0,dVar16);
          dVar16 = pow(10.0,dVar16);
          sprintf(local_98,"%d - %d",(ulong)(uint)((iVar14 + (int)uVar13) * (int)dVar17),
                  (ulong)((iVar14 + (int)uVar13 + 1) * (int)dVar16 - 1));
          printf("%15s : ",local_98);
        }
        if (*(int *)((long)__s + uVar13 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%12d  ");
        }
        printf("    ");
        if (*(int *)((long)local_d8 + uVar13 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%12d  ");
        }
        putchar(10);
      }
      uVar13 = uVar13 + 1;
    } while (uVar11 != uVar13);
  }
  free(__s);
LAB_0068cb00:
  if (local_d8 != (void *)0x0) {
    free(local_d8);
  }
  dVar17 = (double)(p->nObjs - (p->vCis->nSize + p->vCos->nSize));
  printf("Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",dVar15 / dVar17,
         local_c8 / dVar17,(ulong)local_cc,local_c0);
  return;
}

Assistant:

void Emb_ManPrintFanio( Emb_Man_t * p )
{
    char Buffer[100];
    Emb_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts;
    int nFanins, nFanouts, nFaninsMax, nFanoutsMax, nFaninsAll, nFanoutsAll;
    int i, k, nSizeMax;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = 0;
    nFaninsAll = nFanoutsAll = 0;
    Emb_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue; // skip const 0 obj
        nFanins  = Emb_ObjFaninNum(pNode);
        nFanouts = Emb_ObjFanoutNum(pNode);
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nFaninsMax   = Abc_MaxInt( nFaninsMax, nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Emb_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue; // skip const 0 obj
        nFanins  = Emb_ObjFaninNum(pNode);
        nFanouts = Emb_ObjFanoutNum(pNode);

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
    }

    printf( "The distribution of fanins and fanouts in the network:\n" );
    printf( "         Number   Nodes with fanin  Nodes with fanout\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            printf( "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 ); 
            printf( "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanins->pArray[k] );
        printf( "    " );
        if ( vFanouts->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanouts->pArray[k] );
        printf( "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );

    printf( "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n", 
        nFaninsMax,  1.0*nFaninsAll/Emb_ManNodeNum(p), 
        nFanoutsMax, 1.0*nFanoutsAll/Emb_ManNodeNum(p)  );
}